

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_cpp.cpp
# Opt level: O2

string * __thiscall
flatbuffers::cpp::CppGenerator::GenTypeBasic_abi_cxx11_
          (string *__return_storage_ptr__,CppGenerator *this,Type *type,bool user_facing_type)

{
  EnumDef *def;
  undefined7 in_register_00000009;
  char *__s;
  BaseType t;
  allocator<char> local_41;
  string local_40;
  
  if ((int)CONCAT71(in_register_00000009,user_facing_type) == 0) {
    t = type->base_type;
  }
  else {
    def = type->enum_def;
    if (def != (EnumDef *)0x0) {
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"",&local_41);
      BaseGenerator::WrapInNameSpace
                (__return_storage_ptr__,&this->super_BaseGenerator,&def->super_Definition,&local_40)
      ;
      std::__cxx11::string::~string((string *)&local_40);
      return __return_storage_ptr__;
    }
    t = type->base_type;
    if (t == BASE_TYPE_BOOL) {
      __s = "bool";
      goto LAB_0015c891;
    }
  }
  if (t == BASE_TYPE_UTYPE) {
    if (type->enum_def == (EnumDef *)0x0) {
      t = BASE_TYPE_UTYPE;
    }
    else {
      t = (type->enum_def->underlying_type).base_type;
    }
  }
  __s = StringOf(t);
LAB_0015c891:
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,__s,(allocator<char> *)&local_40);
  return __return_storage_ptr__;
}

Assistant:

std::string GenTypeBasic(const Type &type, bool user_facing_type) const {
    if (user_facing_type) {
      if (type.enum_def) return WrapInNameSpace(*type.enum_def);
      if (type.base_type == BASE_TYPE_BOOL) return "bool";
    }
    // Get real underlying type for union type
    auto base_type = type.base_type;
    if (type.base_type == BASE_TYPE_UTYPE && type.enum_def != nullptr) {
      base_type = type.enum_def->underlying_type.base_type;
    }
    return StringOf(base_type);
  }